

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O1

string * __thiscall
tinyusdz::print_prim_metas_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,PrimMeta *meta,uint32_t indent)

{
  Path *pPVar1;
  uint uVar2;
  long lVar3;
  _Base_ptr p_Var4;
  string *psVar5;
  ostream *poVar6;
  long *plVar7;
  _Rb_tree_node_base *p_Var8;
  Reference *pRVar9;
  char *__function;
  bool v;
  ListEditQual v_02;
  bool v_00;
  bool v_01;
  ListEditQual v_03;
  uint32_t n;
  ListEditQual extraout_EDX;
  ListEditQual extraout_EDX_00;
  ListEditQual LVar10;
  ListEditQual extraout_EDX_01;
  ListEditQual extraout_EDX_02;
  uint32_t n_00;
  ListEditQual v_04;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  undefined8 extraout_RDX_29;
  undefined8 extraout_RDX_30;
  undefined8 extraout_RDX_31;
  undefined8 extraout_RDX_32;
  undefined8 extraout_RDX_33;
  undefined8 extraout_RDX_34;
  undefined8 extraout_RDX_35;
  undefined8 extraout_RDX_36;
  undefined8 extraout_RDX_37;
  undefined8 extraout_RDX_38;
  undefined8 extraout_RDX_39;
  APIName *name;
  undefined8 extraout_RDX_40;
  StringData *v_05;
  undefined8 extraout_RDX_41;
  undefined8 extraout_RDX_42;
  undefined8 extraout_RDX_43;
  StringData *v_06;
  undefined8 extraout_RDX_44;
  undefined8 extraout_RDX_45;
  undefined8 extraout_RDX_46;
  undefined8 extraout_RDX_47;
  undefined8 extraout_RDX_48;
  undefined8 extraout_RDX_49;
  undefined8 uVar11;
  uint32_t indent_00;
  PayloadList *payload;
  PrimMetas *this_00;
  _Rb_tree_header *p_Var13;
  long lVar14;
  ulong uVar15;
  undefined1 auVar16 [16];
  type var;
  type vars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  stringstream ss;
  undefined1 local_3d0 [32];
  PrimMetas *local_3b0;
  undefined1 local_3a8 [32];
  string local_388;
  string *local_368;
  undefined1 local_360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [7];
  ios_base local_2e0 [264];
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  pprint *ppVar12;
  
  ppVar12 = (pprint *)((ulong)meta & 0xffffffff);
  indent_00 = (uint32_t)meta;
  local_368 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar11 = extraout_RDX;
  if (*this == (tinyusdz)0x1) {
    pprint::Indent_abi_cxx11_((string *)local_360,ppVar12,(uint32_t)extraout_RDX);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"active = ",9);
    if (*this != (tinyusdz)0x0) {
      to_string_abi_cxx11_((string *)local_3d0,(tinyusdz *)(ulong)(byte)this[1],v);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_3d0._0_8_,local_3d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      uVar11 = extraout_RDX_00;
      if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
        operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
        uVar11 = extraout_RDX_01;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != local_350) {
        operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
        uVar11 = extraout_RDX_02;
      }
      goto LAB_002012f1;
    }
LAB_0020278f:
    __function = "const value_type &nonstd::optional_lite::optional<bool>::value() const [T = bool]"
    ;
    goto LAB_00202800;
  }
LAB_002012f1:
  local_3b0 = (PrimMetas *)this;
  if (this[0x178] == (tinyusdz)0x1) {
    local_3d0._0_8_ = (Path *)(local_3d0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"clips","");
    indent = indent_00;
    print_customData((string *)local_360,(CustomDataType *)(this + 0x180),(string *)local_3d0,
                     indent_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    uVar11 = extraout_RDX_03;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      uVar11 = extraout_RDX_04;
    }
    if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      uVar11 = extraout_RDX_05;
    }
  }
  this_00 = local_3b0;
  if ((local_3b0->instanceable).has_value_ == true) {
    pprint::Indent_abi_cxx11_((string *)local_360,ppVar12,(uint32_t)uVar11);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"instanceable = ",0xf);
    if ((this_00->instanceable).has_value_ == false) goto LAB_0020278f;
    to_string_abi_cxx11_
              ((string *)local_3d0,(tinyusdz *)(ulong)(byte)(this_00->instanceable).contained,v_00);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_3d0._0_8_,local_3d0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    uVar11 = extraout_RDX_06;
    if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      uVar11 = extraout_RDX_07;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      uVar11 = extraout_RDX_08;
    }
  }
  if ((this_00->hidden).has_value_ == true) {
    pprint::Indent_abi_cxx11_((string *)local_360,ppVar12,(uint32_t)uVar11);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"hidden = ",9);
    if ((this_00->hidden).has_value_ == false) goto LAB_0020278f;
    to_string_abi_cxx11_
              ((string *)local_3d0,(tinyusdz *)(ulong)(byte)(this_00->hidden).contained,v_01);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_3d0._0_8_,local_3d0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    uVar11 = extraout_RDX_09;
    if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      uVar11 = extraout_RDX_10;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      uVar11 = extraout_RDX_11;
    }
  }
  if ((this_00->kind).has_value_ == true) {
    pprint::Indent_abi_cxx11_((string *)local_3d0,ppVar12,(uint32_t)uVar11);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_3d0._0_8_,local_3d0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"kind = ",7);
    PrimMetas::get_kind_abi_cxx11_(&local_388,this_00);
    local_1d8 = local_1c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\"","");
    local_360._0_8_ = local_350;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_360,local_1d8,local_1d0 + (long)local_1d8);
    std::__cxx11::string::_M_append((char *)local_360,(ulong)local_388._M_dataplus._M_p);
    plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_360,(ulong)local_1d8);
    this_00 = local_3b0;
    pRVar9 = (Reference *)(plVar7 + 2);
    if ((Reference *)*plVar7 == pRVar9) {
      local_3a8._16_8_ = (pRVar9->asset_path).asset_path_._M_dataplus._M_p;
      local_3a8._24_8_ = plVar7[3];
      local_3a8._0_8_ = (Reference *)(local_3a8 + 0x10);
    }
    else {
      local_3a8._16_8_ = (pRVar9->asset_path).asset_path_._M_dataplus._M_p;
      local_3a8._0_8_ = (Reference *)*plVar7;
    }
    local_3a8._8_8_ = plVar7[1];
    *plVar7 = (long)pRVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
    }
    indent = (uint32_t)pRVar9;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_3a8._0_8_,local_3a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    uVar11 = extraout_RDX_12;
    if ((Reference *)local_3a8._0_8_ != (Reference *)(local_3a8 + 0x10)) {
      operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
      uVar11 = extraout_RDX_13;
    }
    if (local_1d8 != local_1c8) {
      operator_delete(local_1d8,local_1c8[0] + 1);
      uVar11 = extraout_RDX_14;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_388 + 0x10U)) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      uVar11 = extraout_RDX_15;
    }
    if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      uVar11 = extraout_RDX_16;
    }
  }
  ppVar12 = (pprint *)((ulong)meta & 0xffffffff);
  if ((this_00->sceneName).has_value_ == true) {
    pprint::Indent_abi_cxx11_((string *)local_3d0,ppVar12,(uint32_t)uVar11);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_3d0._0_8_,local_3d0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"sceneName = ",0xc);
    if ((this_00->sceneName).has_value_ != false) {
      local_388._M_dataplus._M_p = (pointer)((long)&local_388 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"\"","");
      local_360._0_8_ = local_350;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_360,local_388._M_dataplus._M_p,
                 local_388._M_dataplus._M_p + local_388._M_string_length);
      std::__cxx11::string::_M_append((char *)local_360,*(ulong *)&(this_00->sceneName).contained);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_360,(ulong)local_388._M_dataplus._M_p);
      pRVar9 = (Reference *)(plVar7 + 2);
      if ((Reference *)*plVar7 == pRVar9) {
        local_3a8._16_8_ = (pRVar9->asset_path).asset_path_._M_dataplus._M_p;
        local_3a8._24_8_ = plVar7[3];
        local_3a8._0_8_ = (Reference *)(local_3a8 + 0x10);
      }
      else {
        local_3a8._16_8_ = (pRVar9->asset_path).asset_path_._M_dataplus._M_p;
        local_3a8._0_8_ = (Reference *)*plVar7;
      }
      local_3a8._8_8_ = plVar7[1];
      *plVar7 = (long)pRVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != local_350) {
        operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      }
      indent = (uint32_t)pRVar9;
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_3a8._0_8_,local_3a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      this_00 = local_3b0;
      uVar11 = extraout_RDX_17;
      if ((Reference *)local_3a8._0_8_ != (Reference *)(local_3a8 + 0x10)) {
        operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
        uVar11 = extraout_RDX_18;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_388._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&local_388 + 0x10U)) {
        operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
        uVar11 = extraout_RDX_19;
      }
      if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
        operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
        uVar11 = extraout_RDX_20;
      }
      goto LAB_00201897;
    }
LAB_002027a6:
    __function = 
    "const value_type &nonstd::optional_lite::optional<std::basic_string<char>>::value() const [T = std::basic_string<char>]"
    ;
    goto LAB_00202800;
  }
LAB_00201897:
  if ((this_00->displayName).has_value_ == true) {
    pprint::Indent_abi_cxx11_((string *)local_3d0,ppVar12,(uint32_t)uVar11);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_3d0._0_8_,local_3d0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"displayName = ",0xe);
    if ((this_00->displayName).has_value_ == false) goto LAB_002027a6;
    local_388._M_dataplus._M_p = (pointer)((long)&local_388 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_388,"\"","");
    local_360._0_8_ = local_350;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_360,local_388._M_dataplus._M_p,
               local_388._M_dataplus._M_p + local_388._M_string_length);
    std::__cxx11::string::_M_append((char *)local_360,*(ulong *)&(this_00->displayName).contained);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_360,(ulong)local_388._M_dataplus._M_p);
    pRVar9 = (Reference *)(plVar7 + 2);
    if ((Reference *)*plVar7 == pRVar9) {
      local_3a8._16_8_ = (pRVar9->asset_path).asset_path_._M_dataplus._M_p;
      local_3a8._24_8_ = plVar7[3];
      local_3a8._0_8_ = (Reference *)(local_3a8 + 0x10);
    }
    else {
      local_3a8._16_8_ = (pRVar9->asset_path).asset_path_._M_dataplus._M_p;
      local_3a8._0_8_ = (Reference *)*plVar7;
    }
    local_3a8._8_8_ = plVar7[1];
    *plVar7 = (long)pRVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
    }
    indent = (uint32_t)pRVar9;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_3a8._0_8_,local_3a8._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
    this_00 = local_3b0;
    uVar11 = extraout_RDX_21;
    if ((Reference *)local_3a8._0_8_ != (Reference *)(local_3a8 + 0x10)) {
      operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
      uVar11 = extraout_RDX_22;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_388 + 0x10U)) {
      operator_delete(local_388._M_dataplus._M_p,local_388.field_2._M_allocated_capacity + 1);
      uVar11 = extraout_RDX_23;
    }
    if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      uVar11 = extraout_RDX_24;
    }
  }
  if ((this_00->assetInfo).has_value_ == true) {
    local_3d0._0_8_ = (Path *)(local_3d0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"assetInfo","");
    indent = indent_00;
    print_customData((string *)local_360,(CustomDataType *)&(this_00->assetInfo).contained,
                     (string *)local_3d0,indent_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    uVar11 = extraout_RDX_25;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      uVar11 = extraout_RDX_26;
    }
    this_00 = local_3b0;
    if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      uVar11 = extraout_RDX_27;
      this_00 = local_3b0;
    }
  }
  if ((this_00->inherits).has_value_ == true) {
    pprint::Indent_abi_cxx11_((string *)local_360,ppVar12,(uint32_t)uVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
    }
    if ((this_00->inherits).has_value_ != false) {
      uVar2 = *(uint *)&(this_00->inherits).contained;
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d0,
                 (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                 ((long)&(this_00->inherits).contained + 8));
      if (uVar2 != 0) {
        to_string_abi_cxx11_((string *)local_360,(tinyusdz *)(ulong)uVar2,v_02);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._0_8_ != local_350) {
          operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
        }
      }
      lVar14 = local_3d0._8_8_ - local_3d0._0_8_;
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"inherits = ",0xb);
      if (lVar14 == 0xd0) {
        std::operator<<(local_1a8,(Path *)local_3d0._0_8_);
      }
      else {
        std::operator<<(local_1a8,
                        (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
      std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d0);
      uVar11 = extraout_RDX_28;
      goto LAB_00201c09;
    }
LAB_002027bd:
    __function = 
    "const value_type &nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual, std::vector<tinyusdz::Path>>>::value() const [T = std::pair<tinyusdz::ListEditQual, std::vector<tinyusdz::Path>>]"
    ;
    goto LAB_00202800;
  }
LAB_00201c09:
  if ((this_00->specializes).has_value_ == true) {
    pprint::Indent_abi_cxx11_
              ((string *)local_360,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
    }
    if ((this_00->specializes).has_value_ == false) goto LAB_002027bd;
    uVar2 = *(uint *)&(this_00->specializes).contained;
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d0,
               (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
               ((long)&(this_00->specializes).contained + 8));
    if (uVar2 != 0) {
      to_string_abi_cxx11_((string *)local_360,(tinyusdz *)(ulong)uVar2,v_03);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != local_350) {
        operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      }
    }
    lVar14 = local_3d0._8_8_ - local_3d0._0_8_;
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"specializes = ",0xe);
    if (lVar14 == 0xd0) {
      std::operator<<(local_1a8,(Path *)local_3d0._0_8_);
    }
    else {
      std::operator<<(local_1a8,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d0
                     );
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
              ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_3d0);
    uVar11 = extraout_RDX_29;
  }
  if ((this_00->references).has_value_ == true) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_360);
    uVar2 = *(uint *)&(this_00->references).contained;
    std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::vector
              ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)local_3a8,
               (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)
               ((long)&(this_00->references).contained + 8));
    pprint::Indent_abi_cxx11_((string *)local_3d0,(pprint *)((ulong)meta & 0xffffffff),n);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350[0]._M_local_buf,(char *)local_3d0._0_8_,local_3d0._8_8_);
    pPVar1 = (Path *)(local_3d0 + 0x10);
    LVar10 = extraout_EDX;
    if ((Path *)local_3d0._0_8_ != pPVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      LVar10 = extraout_EDX_00;
    }
    if (uVar2 != 0) {
      to_string_abi_cxx11_((string *)local_3d0,(tinyusdz *)(ulong)uVar2,LVar10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_350[0]._M_local_buf,(char *)local_3d0._0_8_,
                          local_3d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      if ((Path *)local_3d0._0_8_ != pPVar1) {
        operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_350[0]._M_local_buf,"references = ",0xd);
    if (local_3a8._0_8_ == local_3a8._8_8_) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_350[0]._M_local_buf,"None",4);
    }
    else if (local_3a8._8_8_ - local_3a8._0_8_ == 0x150) {
      std::operator<<((ostream *)local_350[0]._M_local_buf,(Reference *)local_3a8._0_8_);
    }
    else {
      std::operator<<((ostream *)local_350[0]._M_local_buf,
                      (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)local_3a8
                     );
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_350[0]._M_local_buf,"\n",1);
    std::__cxx11::stringbuf::str();
    std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>::~vector
              ((vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)local_3a8);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_360);
    std::ios_base::~ios_base(local_2e0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_3d0._0_8_,local_3d0._8_8_);
    uVar11 = extraout_RDX_30;
    if ((Path *)local_3d0._0_8_ != pPVar1) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      uVar11 = extraout_RDX_31;
    }
  }
  payload = (PayloadList *)((ulong)meta & 0xffffffff);
  if ((this_00->payload).has_value_ == true) {
    print_payload_abi_cxx11_
              ((string *)local_360,(tinyusdz *)&(this_00->payload).contained,payload,indent);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    uVar11 = extraout_RDX_32;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      uVar11 = extraout_RDX_33;
    }
  }
  if ((this_00->sdrMetadata).has_value_ == true) {
    local_3d0._0_8_ = (Path *)(local_3d0 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"sdrMetadata","");
    indent = indent_00;
    print_customData((string *)local_360,(CustomDataType *)&(this_00->sdrMetadata).contained,
                     (string *)local_3d0,indent_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    uVar11 = extraout_RDX_34;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      uVar11 = extraout_RDX_35;
    }
    this_00 = local_3b0;
    if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
      operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      uVar11 = extraout_RDX_36;
      this_00 = local_3b0;
    }
  }
  if ((this_00->variants).has_value_ == true) {
    print_variantSelectionMap
              ((string *)local_360,(VariantSelectionMap *)&(this_00->variants).contained,indent_00);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    uVar11 = extraout_RDX_37;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      uVar11 = extraout_RDX_38;
    }
  }
  if ((this_00->variantSets).has_value_ == true) {
    pprint::Indent_abi_cxx11_((string *)local_360,(pprint *)payload,(uint32_t)uVar11);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    LVar10 = extraout_EDX_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._0_8_ != local_350) {
      operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      LVar10 = extraout_EDX_02;
    }
    if ((this_00->variantSets).has_value_ == false) {
      __function = 
      "const value_type &nonstd::optional_lite::optional<std::pair<tinyusdz::ListEditQual, std::vector<std::basic_string<char>>>>::value() const [T = std::pair<tinyusdz::ListEditQual, std::vector<std::basic_string<char>>>]"
      ;
      goto LAB_00202800;
    }
    uVar2 = *(uint *)&(this_00->variantSets).contained;
    if (uVar2 != 0) {
      to_string_abi_cxx11_((string *)local_360,(tinyusdz *)(ulong)uVar2,LVar10);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != local_350) {
        operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"variantSets = ",0xe);
    if (*(long *)((long)&(this_00->variantSets).contained + 8) ==
        *(long *)((long)&(this_00->variantSets).contained + 0x10)) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"None",4);
    }
    else {
      to_string<std::__cxx11::string>
                ((string *)local_360,(tinyusdz *)((long)&(this_00->variantSets).contained + 8),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0,indent);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != local_350) {
        operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\n",1);
    uVar11 = extraout_RDX_39;
  }
  if ((this_00->apiSchemas).has_value_ == true) {
    local_360._0_4_ = *(undefined4 *)&(this_00->apiSchemas).contained;
    std::
    vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_360 + 8),
             (vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&(this_00->apiSchemas).contained + 8));
    if (local_350[0]._M_allocated_capacity != local_360._8_8_) {
      pprint::Indent_abi_cxx11_((string *)local_3d0,(pprint *)payload,n_00);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_3d0._0_8_,local_3d0._8_8_);
      to_string_abi_cxx11_((string *)local_3a8,(tinyusdz *)(local_360._0_8_ & 0xffffffff),v_04);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_3a8._0_8_,local_3a8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," apiSchemas = [",0xf);
      if ((Reference *)local_3a8._0_8_ != (Reference *)(local_3a8 + 0x10)) {
        operator_delete((void *)local_3a8._0_8_,(ulong)(local_3a8._16_8_ + 1));
      }
      pPVar1 = (Path *)(local_3d0 + 0x10);
      if ((Path *)local_3d0._0_8_ != pPVar1) {
        operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
      }
      if (local_350[0]._M_allocated_capacity != local_360._8_8_) {
        lVar14 = 0;
        uVar15 = 0;
        do {
          if (uVar15 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
          }
          local_3a8._0_4_ = *(undefined4 *)(local_360._8_8_ + lVar14);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
          to_string_abi_cxx11_((string *)local_3d0,(tinyusdz *)local_3a8,name);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(char *)local_3d0._0_8_,local_3d0._8_8_);
          if ((Path *)local_3d0._0_8_ != pPVar1) {
            operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
          }
          lVar3 = *(long *)(local_360._8_8_ + lVar14 + 8);
          local_3d0._0_8_ = pPVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3d0,lVar3,*(long *)(local_360._8_8_ + lVar14 + 0x10) + lVar3);
          if ((pointer)local_3d0._8_8_ != (pointer)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,":",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,(char *)local_3d0._0_8_,local_3d0._8_8_);
          }
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
          if ((Path *)local_3d0._0_8_ != pPVar1) {
            operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
          }
          uVar15 = uVar15 + 1;
          lVar14 = lVar14 + 0x28;
        } while (uVar15 < (ulong)(((long)(local_350[0]._M_allocated_capacity - local_360._8_8_) >> 3
                                  ) * -0x3333333333333333));
      }
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"]\n",2);
      this_00 = local_3b0;
    }
    std::
    vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_360 + 8));
    uVar11 = extraout_RDX_40;
  }
  if ((this_00->doc).has_value_ == true) {
    pprint::Indent_abi_cxx11_
              ((string *)local_360,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar11);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"doc = ",6);
    if ((this_00->doc).has_value_ != false) {
      to_string_abi_cxx11_((string *)local_3d0,(tinyusdz *)&(this_00->doc).contained,v_05);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_3d0._0_8_,local_3d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      uVar11 = extraout_RDX_41;
      if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
        operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
        uVar11 = extraout_RDX_42;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != local_350) {
        operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
        uVar11 = extraout_RDX_43;
      }
      goto LAB_00202483;
    }
  }
  else {
LAB_00202483:
    if ((this_00->comment).has_value_ != true) {
LAB_00202551:
      if ((this_00->customData).has_value_ == true) {
        local_3d0._0_8_ = (Path *)(local_3d0 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"customData","");
        print_customData((string *)local_360,(CustomDataType *)&(this_00->customData).contained,
                         (string *)local_3d0,indent_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
        uVar11 = extraout_RDX_47;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._0_8_ != local_350) {
          operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
          uVar11 = extraout_RDX_48;
        }
        this_00 = local_3b0;
        if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
          operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
          uVar11 = extraout_RDX_49;
          this_00 = local_3b0;
        }
      }
      p_Var4 = (this_00->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      auVar16._8_8_ = uVar11;
      auVar16._0_8_ = p_Var4;
      p_Var13 = &(this_00->unregisteredMetas)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var4 != p_Var13) {
        do {
          p_Var8 = auVar16._0_8_;
          pprint::Indent_abi_cxx11_
                    ((string *)local_360,(pprint *)((ulong)meta & 0xffffffff),auVar16._8_4_);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,*(char **)(p_Var8 + 2),(long)p_Var8[2]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._0_8_ != local_350) {
            operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
          }
          auVar16 = std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)auVar16._0_8_ != p_Var13);
      }
      p_Var8 = *(_Base_ptr *)
                ((long)&(local_3b0->meta)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      p_Var13 = &(local_3b0->meta)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var8 != p_Var13) {
        do {
          print_meta((string *)local_360,(MetaVariable *)(p_Var8 + 2),indent_00 + 1,true,
                     (string *)(p_Var8 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._0_8_ != local_350) {
            operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
          }
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != p_Var13);
      }
      psVar5 = local_368;
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      return psVar5;
    }
    pprint::Indent_abi_cxx11_
              ((string *)local_360,(pprint *)((ulong)meta & 0xffffffff),(uint32_t)uVar11);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(char *)local_360._0_8_,local_360._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"comment = ",10);
    if ((this_00->comment).has_value_ != false) {
      to_string_abi_cxx11_((string *)local_3d0,(tinyusdz *)&(this_00->comment).contained,v_06);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,(char *)local_3d0._0_8_,local_3d0._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
      uVar11 = extraout_RDX_44;
      if ((Path *)local_3d0._0_8_ != (Path *)(local_3d0 + 0x10)) {
        operator_delete((void *)local_3d0._0_8_,local_3d0._16_8_ + 1);
        uVar11 = extraout_RDX_45;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._0_8_ != local_350) {
        operator_delete((void *)local_360._0_8_,local_350[0]._M_allocated_capacity + 1);
        uVar11 = extraout_RDX_46;
      }
      goto LAB_00202551;
    }
  }
  __function = 
  "const value_type &nonstd::optional_lite::optional<tinyusdz::value::StringData>::value() const [T = tinyusdz::value::StringData]"
  ;
LAB_00202800:
  __assert_fail("has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                ,0x584,__function);
}

Assistant:

std::string print_prim_metas(const PrimMeta &meta, const uint32_t indent) {
  std::stringstream ss;

  if (meta.active) {
    ss << pprint::Indent(indent)
       << "active = " << to_string(meta.active.value()) << "\n";
  }

  if (meta.clips) {
    ss << print_customData(meta.clips.value(), "clips", indent);
  }

  if (meta.instanceable) {
    ss << pprint::Indent(indent)
       << "instanceable = " << to_string(meta.instanceable.value()) << "\n";
  }

  if (meta.hidden) {
    ss << pprint::Indent(indent)
       << "hidden = " << to_string(meta.hidden.value()) << "\n";
  }

  if (meta.kind) {
    ss << pprint::Indent(indent) << "kind = " << quote(meta.get_kind()) << "\n";
  }

  // TODO: UTF-8 ready pprint
  if (meta.sceneName) {
    ss << pprint::Indent(indent)
       << "sceneName = " << quote(meta.sceneName.value()) << "\n";
  }

  // TODO: UTF-8 ready pprint
  if (meta.displayName) {
    ss << pprint::Indent(indent)
       << "displayName = " << quote(meta.displayName.value()) << "\n";
  }

  if (meta.assetInfo) {
    ss << print_customData(meta.assetInfo.value(), "assetInfo", indent);
  }

  if (meta.inherits) {
    ss << pprint::Indent(indent);
    auto listEditQual = std::get<0>(meta.inherits.value());
    auto var = std::get<1>(meta.inherits.value());

    if (listEditQual != ListEditQual::ResetToExplicit) {
      ss << to_string(listEditQual) << " ";
    }

    if (var.size() == 1) {
      // print as scalar
      ss << "inherits = " << var[0];
    } else {
      ss << "inherits = " << var;
    }
    ss << "\n";
  }

  if (meta.specializes) {
    ss << pprint::Indent(indent);
    auto listEditQual = std::get<0>(meta.specializes.value());
    auto var = std::get<1>(meta.specializes.value());

    if (listEditQual != ListEditQual::ResetToExplicit) {
      ss << to_string(listEditQual) << " ";
    }

    if (var.size() == 1) {
      // print as scalar
      ss << "specializes = " << var[0];
    } else {
      ss << "specializes = " << var;
    }
    ss << "\n";
  }

  if (meta.references) {
    ss << print_references(meta.references.value(), indent);
  }

  if (meta.payload) {
    ss << print_payload(meta.payload.value(), indent);
  }

  // TODO: only print in usdShade Prims.
  if (meta.sdrMetadata) {
    ss << print_customData(meta.sdrMetadata.value(), "sdrMetadata", indent);
  }

  if (meta.variants) {
    ss << print_variantSelectionMap(meta.variants.value(), indent);
  }

  if (meta.variantSets) {
    ss << pprint::Indent(indent);
    auto listEditQual = std::get<0>(meta.variantSets.value());
    const std::vector<std::string> &vs =
        std::get<1>(meta.variantSets.value());  // string[]

    if (listEditQual != ListEditQual::ResetToExplicit) {
      ss << to_string(listEditQual) << " ";
    }

    ss << "variantSets = ";

    if (vs.empty()) {
      ss << "None";
    } else {
      ss << to_string(vs);
    }

    ss << "\n";
  }

  if (meta.apiSchemas) {
    auto schemas = meta.apiSchemas.value();

    if (schemas.names.size()) {
      ss << pprint::Indent(indent) << to_string(schemas.listOpQual)
         << " apiSchemas = [";

      for (size_t i = 0; i < schemas.names.size(); i++) {
        if (i != 0) {
          ss << ", ";
        }

        auto name = std::get<0>(schemas.names[i]);
        ss << "\"" << to_string(name);

        auto instanceName = std::get<1>(schemas.names[i]);

        if (!instanceName.empty()) {
          ss << ":" << instanceName;
        }

        ss << "\"";
      }
      ss << "]\n";
    }
  }

  if (meta.doc) {
    ss << pprint::Indent(indent) << "doc = " << to_string(meta.doc.value())
       << "\n";
  }

  if (meta.comment) {
    ss << pprint::Indent(indent)
       << "comment = " << to_string(meta.comment.value()) << "\n";
  }

  if (meta.customData) {
    ss << print_customData(meta.customData.value(), "customData", indent);
  }

  for (const auto &item : meta.unregisteredMetas) {
    // do not quote
    ss << pprint::Indent(indent) << item.first << " = " << item.second << "\n";
  }

  // TODO: deprecate meta.meta and remove it.
  for (const auto &item : meta.meta) {
    ss << print_meta(item.second, indent + 1, true, item.first);
  }

  // for (const auto &item : meta.stringData) {
  //   ss << pprint::Indent(indent) << to_string(item) << "\n";
  // }

  return ss.str();
}